

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRun
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms,string *additionalDef,bool negativeCompile,bool negativeLink)

{
  CallLogWrapper *this_00;
  __aligned_membuf<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_> *__x;
  uint *__args;
  GLenum GVar1;
  GLsizei width;
  uint uVar2;
  _Rb_tree_color _Var3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  TestLog *this_01;
  undefined8 uVar6;
  GLint GVar7;
  _Base_ptr p_Var8;
  undefined1 *puVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  GLuint GVar13;
  ContextType type;
  uint uVar14;
  uint uVar15;
  _Rb_tree_color _Var16;
  _Rb_tree_color _Var17;
  pointer pSVar18;
  iterator iVar19;
  ostream *poVar20;
  _Link_type p_Var21;
  _Base_ptr p_Var22;
  _Rb_tree_node_base *p_Var23;
  pointer pCVar24;
  pointer pCVar25;
  CompiledProgram *pCVar26;
  pointer puVar27;
  SubroutineFunction *this_02;
  GLenum *pGVar28;
  float *pfVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar30;
  pointer pvVar31;
  _Rb_tree_header *outTemporary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  undefined1 *puVar32;
  _Base_ptr p_Var33;
  allocator_type *__a;
  allocator_type *__a_00;
  ShaderKey *extraout_RDX;
  ShaderKey *__y;
  ShaderKey *__y_00;
  ShaderKey *__y_01;
  ShaderKey *__y_02;
  _Link_type p_Var34;
  _Link_type p_Var35;
  pointer pUVar36;
  _Self __tmp;
  ulong uVar37;
  _Link_type p_Var38;
  pointer pSVar39;
  byte bVar40;
  GLenum GVar41;
  long lVar42;
  char *__p;
  undefined1 *puVar43;
  undefined1 *puVar44;
  _Base_ptr p_Var45;
  pointer pSVar46;
  uint __tmp_6;
  ShaderKey *__x_01;
  __aligned_membuf<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_> *__x_02;
  int iVar47;
  int iVar48;
  pointer pCVar49;
  ulong uVar50;
  pointer pvVar51;
  pointer pCVar52;
  pointer pCVar53;
  SubroutineUniform *pSVar54;
  undefined1 auVar55 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar56;
  ulong local_16c8;
  uint __tmp_5;
  ulong local_16a8;
  uint __tmp_4;
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  programConfigs;
  ulong local_1660;
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  shaders;
  ulong local_1620;
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  programs;
  ulong local_15f8;
  GLuint vao;
  GLuint vbo;
  size_type __dnew;
  GLenum *local_15e0;
  GLenum *local_15d8;
  int local_15cc;
  GLint maxIndex;
  GLint maxLocation;
  string parentUniformName;
  ulong local_15a0;
  size_type __dnew_1;
  undefined1 local_1580 [24];
  _Base_ptr local_1568;
  size_t local_1560;
  ostringstream name_1;
  GLfloat coords [16];
  ostringstream name;
  
  parentUniformName._M_dataplus._M_p = (pointer)&parentUniformName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parentUniformName,0x1aee929);
  if ((uniforms->
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (uniforms->
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar42 = 0;
    uVar37 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"u",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&name);
      pUVar36 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      Uniform::setName((Uniform *)((long)&(pUVar36->type).enumType + lVar42),&parentUniformName,
                       (string *)&name_1);
      if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base
                ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      uVar37 = uVar37 + 1;
      lVar42 = lVar42 + 0x1d8;
    } while (uVar37 < (ulong)(((long)(uniforms->
                                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(uniforms->
                                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x34115b1e5f75270d));
  }
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    ___tmp_4 = 0;
    iVar48 = 0;
    iVar47 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name_1,"u",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&name_1);
      pSVar46 = (subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pSVar46[___tmp_4].name);
      if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      pSVar46 = (subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pSVar46[___tmp_4].functions.typeName._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"st",2);
        std::ostream::operator<<((ostringstream *)&name,iVar47);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&pSVar46[___tmp_4].functions.typeName,(string *)&__dnew_1);
        if ((undefined1 *)__dnew_1 != local_1580 + 8) {
          operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
        }
        iVar47 = iVar47 + 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base
                  ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        pSVar46 = (subroutineUniforms->
                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar39 = *(pointer *)
                   &pSVar46[___tmp_4].functions.fn.
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
        ;
        if (pSVar46[___tmp_4].functions.fn.
            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ._M_impl.super__Vector_impl_data._M_finish != pSVar39) {
          lVar42 = 0xe8;
          uVar37 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"sf",2);
            std::ostream::operator<<((ostringstream *)&name,iVar48 + (int)uVar37);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=
                      ((string *)((long)&(pSVar39->index).super_LayoutSpecifierBase.val + lVar42),
                       (string *)&__dnew_1);
            if ((undefined1 *)__dnew_1 != local_1580 + 8) {
              operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            uVar37 = uVar37 + 1;
            pSVar46 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar39 = *(pointer *)
                       &pSVar46[___tmp_4].functions.fn.
                        super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ;
            lVar42 = lVar42 + 0x108;
          } while (uVar37 < (ulong)(((long)pSVar46[___tmp_4].functions.fn.
                                           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar39 >> 3) * 0xf83e0f83e0f83e1));
          iVar48 = iVar48 + (int)uVar37;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
      std::ios_base::~ios_base
                ((ios_base *)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      ___tmp_4 = ___tmp_4 + 1;
    } while (___tmp_4 <
             (ulong)(((long)(subroutineUniforms->
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(subroutineUniforms->
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5));
  }
  coords[0xc] = -1.0;
  coords[0xd] = 1.0;
  coords[0xe] = 0.0;
  coords[0xf] = 1.0;
  coords[8] = -1.0;
  coords[9] = -1.0;
  coords[10] = 0.0;
  coords[0xb] = 1.0;
  coords[4] = 1.0;
  coords[5] = 1.0;
  coords[6] = 0.0;
  coords[7] = 1.0;
  coords[0] = 1.0;
  coords[1] = -1.0;
  coords[2] = 0.0;
  coords[3] = 1.0;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&vbo);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,coords,0x88e4);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(this_00,vao);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,2,__a);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ & 0xffffffffffffff00;
  puVar44 = local_1580 + 8;
  __dnew = 0x13;
  __dnew_1 = (size_type)puVar44;
  __dnew_1 = std::__cxx11::string::_M_create(&__dnew_1,(ulong)&__dnew);
  local_1580._8_8_ = __dnew;
  builtin_strncpy((char *)__dnew_1,"vs_ValidationResult",0x13);
  local_1580._0_8_ = __dnew;
  *(char *)(__dnew_1 + __dnew) = '\0';
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b31,(string *)&name_1,(string *)&__dnew_1);
  uVar6 = shaders._M_t._M_impl._0_8_;
  *(GLuint *)shaders._M_t._M_impl._0_8_ =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(shaders._M_t._M_impl._0_8_ + 8),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x28),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  puVar9 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x38;
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar9) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  puVar32 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar44) {
    operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  __dnew_1 = 0x13;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)std::__cxx11::string::_M_create((ulong *)&name_1,(ulong)&__dnew_1);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = __dnew_1;
  *name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int *)0x64696c61565f7376;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[1] =
       (_func_int *)0x7365526e6f697461;
  builtin_strncpy((char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream + 0xf),"sult",4);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = __dnew_1;
  *(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
           __dnew_1) = '\0';
  local_1580._0_8_ = (_func_int **)0x0;
  local_1580._8_8_ = local_1580._8_8_ & 0xffffffffffffff00;
  __dnew_1 = (size_type)puVar44;
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b30,(string *)&name_1,(string *)&__dnew_1);
  *(GLuint *)(uVar6 + 0x48) =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x50),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x70),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar9) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar44) {
    operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,1,__a_00);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ & 0xffffffffffffff00;
  local_1580._0_8_ = (_func_int **)0x0;
  local_1580._8_8_ = local_1580._8_8_ & 0xffffffffffffff00;
  __dnew_1 = (size_type)puVar44;
  ShaderKey::ShaderKey((ShaderKey *)&name,0x91b9,(string *)&name_1,(string *)&__dnew_1);
  uVar6 = shaders._M_t._M_impl._0_8_;
  *(GLuint *)shaders._M_t._M_impl._0_8_ =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(shaders._M_t._M_impl._0_8_ + 8),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x28),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar9) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar44) {
    operator_delete((void *)__dnew_1,(ulong)(local_1580._8_8_ + 1));
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  __p = (char *)&shaders;
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)__p);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)shaders._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  local_16c8 = 0;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar31 = programConfigs.
            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar51 = programConfigs.
            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (programConfigs.
      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      programConfigs.
      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar37 = 0;
    pvVar51 = programConfigs.
              super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pSVar18 = pvVar31[uVar37].
                super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar31[uVar37].
          super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar18) {
        uVar50 = 0;
        do {
          __p = (char *)(pSVar18 + uVar50);
          iVar19 = std::
                   map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                   ::find(&shaders,(key_type *)__p);
          pvVar31 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          outTemporary = &shaders._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar19._M_node == outTemporary) {
            GVar13 = glu::CallLogWrapper::glCreateShader
                               (this_00,programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                        super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar50].stage);
            pSVar18 = pvVar31[uVar37].
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar50;
            type.super_ApiType.m_bits =
                 (ApiType)(*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                            _vptr_RenderContext[2])();
            GVar1 = pSVar18->stage;
            if (GVar1 == 0x8b30) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x8b30,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x8b30,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\nin vec4 ",9);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,(pSVar18->input)._M_dataplus._M_p,
                                   (pSVar18->input)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\nout vec4 out_FragColor;",0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\n    vec4 validationResult = ",0x1d);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,(pSVar18->input)._M_dataplus._M_p,
                                   (pSVar18->input)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,";",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              ShaderSourceFactory::streamUniformValidators
                        (&name,uniforms,0x8b30,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x8b30,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    out_FragColor =  validationResult;",0x27);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            else if (GVar1 == 0x91b9) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\nlayout (local_size_x = 1, local_size_y = 1) in;",0x30);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\nlayout (std430, binding = 1) buffer ResultBuffer {",0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    vec4 cs_ValidationResult;",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n};",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x91b9,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x91b9,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);",0x36);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              ShaderSourceFactory::streamUniformValidators
                        (&name,uniforms,0x91b9,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x91b9,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    cs_ValidationResult =  validationResult;",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            else {
              if (GVar1 != 0x8b31) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                              ,0x4b4,
                              "static std::string glcts::(anonymous namespace)::ShaderSourceFactory::generateShader(const ShaderKey &, const std::vector<Uniform> &, const std::vector<SubroutineUniform> &, const std::string &, const glu::ContextType)"
                             );
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x8b31,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x8b31,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\nin vec4 in_Position;",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\nout vec4 ",10);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,(pSVar18->output)._M_dataplus._M_p,
                                   (pSVar18->output)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,";",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);",0x36);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              ShaderSourceFactory::streamUniformValidators
                        (&name,uniforms,0x8b31,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x8b31,(char *)outTemporary);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n    ",5);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (pSVar18->output)._M_dataplus._M_p,
                                   (pSVar18->output)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20," = validationResult;",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"\n    gl_Position = in_Position;",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
            glu::CallLogWrapper::glShaderSource(this_00,GVar13,1,(GLchar **)&name,(GLint *)0x0);
            __x_01 = pvVar31[uVar37].
                     super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar50;
            p_Var38 = (_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header;
            __y = extraout_RDX;
            p_Var21 = (_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            if (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00bad65f:
              bVar10 = true;
LAB_00bad662:
              p_Var21 = (_Link_type)operator_new(0x70);
              *(GLenum *)(p_Var21->_M_storage)._M_storage = __x_01->stage;
              *(uchar **)((p_Var21->_M_storage)._M_storage + 8) =
                   (p_Var21->_M_storage)._M_storage + 0x18;
              pcVar4 = (__x_01->input)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((p_Var21->_M_storage)._M_storage + 8),pcVar4,
                         pcVar4 + (__x_01->input)._M_string_length);
              *(uchar **)((p_Var21->_M_storage)._M_storage + 0x28) =
                   (p_Var21->_M_storage)._M_storage + 0x38;
              pcVar4 = (__x_01->output)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((p_Var21->_M_storage)._M_storage + 0x28),pcVar4,
                         pcVar4 + (__x_01->output)._M_string_length);
              __x_02 = &p_Var21->_M_storage;
              (p_Var21->_M_storage)._M_storage[0x48] = '\0';
              (p_Var21->_M_storage)._M_storage[0x49] = '\0';
              (p_Var21->_M_storage)._M_storage[0x4a] = '\0';
              (p_Var21->_M_storage)._M_storage[0x4b] = '\0';
              if (bVar10) {
                if ((shaders._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
                   (__p = (char *)__x_02,
                   bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                      ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                       (shaders._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_right + 1),(ShaderKey *)__x_02,__y_01), !bVar10)) {
LAB_00bad74a:
                  __p = (char *)__x_02;
                  pVar56 = std::
                           _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                           ::_M_get_insert_unique_pos(&shaders._M_t,(key_type *)__x_02);
                }
                else {
LAB_00bad7a8:
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  pVar56 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                           (auVar5 << 0x40);
                }
LAB_00bad7aa:
                p_Var35 = (_Link_type)pVar56.second;
                p_Var38 = (_Link_type)pVar56.first;
                if (p_Var35 == (_Link_type)0x0) {
LAB_00bad7e6:
                  std::
                  _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                  ::_M_drop_node((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                                  *)p_Var21,(_Link_type)__p);
                  goto LAB_00bad82f;
                }
              }
              else {
                __x = &p_Var38->_M_storage;
                __p = (char *)__x;
                bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                   ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                    (ShaderKey *)__x,__y_01);
                if (!bVar10) {
                  __p = (char *)__x_02;
                  bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                     ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x,
                                      (ShaderKey *)__x_02,__y_02);
                  if (bVar10) {
                    if ((_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                        p_Var38) goto LAB_00bad7a8;
                    auVar55 = std::_Rb_tree_increment(&p_Var38->super__Rb_tree_node_base);
                    p_Var34 = auVar55._0_8_;
                    __p = (char *)&p_Var34->_M_storage;
                    bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                       ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                        (ShaderKey *)__p,auVar55._8_8_);
                    if (!bVar10) goto LAB_00bad74a;
                    pVar56.second = &p_Var34->super__Rb_tree_node_base;
                    pVar56.first = &p_Var34->super__Rb_tree_node_base;
                    p_Var35 = p_Var38;
                    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(p_Var38->super__Rb_tree_node_base)._M_right)->_M_allocated_capacity ==
                        0) goto LAB_00bad7a4;
                    goto LAB_00bad7aa;
                  }
                  goto LAB_00bad7e6;
                }
                pVar56.second = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                pVar56.first = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                    p_Var38) goto LAB_00bad7aa;
                auVar55 = std::_Rb_tree_decrement(&p_Var38->super__Rb_tree_node_base);
                p_Var35 = auVar55._0_8_;
                __p = (char *)__x_02;
                bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                   ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                    &p_Var35->_M_storage,(ShaderKey *)__x_02,auVar55._8_8_);
                if (!bVar10) goto LAB_00bad74a;
                pVar56.second = &p_Var38->super__Rb_tree_node_base;
                pVar56.first = &p_Var38->super__Rb_tree_node_base;
                p_Var34 = p_Var38;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&(p_Var35->super__Rb_tree_node_base)._M_right)->_M_allocated_capacity != 0)
                goto LAB_00bad7aa;
LAB_00bad7a4:
                auVar55._8_8_ = 0;
                auVar55._0_8_ = p_Var34;
                pVar56 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                         (auVar55 << 0x40);
              }
              bVar10 = true;
              if ((pVar56.first == (_Rb_tree_node_base *)0x0) &&
                 ((_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header != p_Var35)) {
                bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                   ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                    (ShaderKey *)&p_Var35->_M_storage,(ShaderKey *)pVar56.second);
              }
              __p = (char *)p_Var21;
              std::_Rb_tree_insert_and_rebalance
                        (bVar10,(_Rb_tree_node_base *)p_Var21,&p_Var35->super__Rb_tree_node_base,
                         &shaders._M_t._M_impl.super__Rb_tree_header._M_header);
              shaders._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   shaders._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
              p_Var38 = p_Var21;
            }
            else {
              do {
                p_Var35 = p_Var38;
                __p = (char *)&p_Var21->_M_storage;
                bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                   ((less<glcts::(anonymous_namespace)::ShaderKey> *)__p,__x_01,__y)
                ;
                p_Var34 = *(_Link_type *)
                           ((p_Var21->_M_storage)._M_storage + (ulong)bVar10 * 8 + -0x10);
                p_Var38 = p_Var21;
                if (bVar10) {
                  p_Var38 = p_Var35;
                }
                __y = __y_00;
                p_Var21 = p_Var34;
              } while (p_Var34 != (_Link_type)0x0);
              if (p_Var38 == (_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header)
              goto LAB_00bad65f;
              if (bVar10) {
                __p = (char *)&p_Var35->_M_storage;
              }
              bVar10 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                 ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_01,
                                  (ShaderKey *)__p,__y_00);
              if (bVar10) {
                bVar10 = false;
                goto LAB_00bad662;
              }
            }
LAB_00bad82f:
            *(GLuint *)((p_Var38->_M_storage)._M_storage + 0x48) = GVar13;
            if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
            {
              __p = (char *)(name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,(ulong)__p);
            }
          }
          uVar50 = uVar50 + 1;
          pSVar18 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar37].
                    super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar31 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar51 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar50 < (ulong)(((long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                         super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18
                                  >> 3) * -0x71c71c71c71c71c7));
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)(((long)pvVar51 - (long)pvVar31 >> 3) * -0x5555555555555555));
    p_Var22 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &shaders._M_t._M_impl.super__Rb_tree_header) {
      do {
        __p = (char *)(ulong)*(uint *)&p_Var22[3]._M_parent;
        glu::CallLogWrapper::glCompileShader(this_00,*(uint *)&p_Var22[3]._M_parent);
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
      } while ((_Rb_tree_header *)p_Var22 != &shaders._M_t._M_impl.super__Rb_tree_header);
    }
    if ((_Rb_tree_header *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &shaders._M_t._M_impl.super__Rb_tree_header) {
      local_16c8 = 0;
    }
    else {
      local_16c8 = 0;
      p_Var22 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,*(GLuint *)&p_Var22[3]._M_parent,0x8b81,(GLint *)&__dnew);
        glu::CallLogWrapper::glGetShaderSource
                  (this_00,*(GLuint *)&p_Var22[3]._M_parent,4000,(GLsizei *)0x0,(GLchar *)&name);
        glu::CallLogWrapper::glGetShaderInfoLog
                  (this_00,*(GLuint *)&p_Var22[3]._M_parent,1000,(GLsizei *)0x0,(GLchar *)&name_1);
        tcu::TestLog::writeKernelSource
                  (glcts::(anonymous_namespace)::Logger::s_tcuLog,(char *)&name);
        __p = "shader";
        tcu::TestLog::writeCompileInfo
                  (glcts::(anonymous_namespace)::Logger::s_tcuLog,"shader",
                   fixed_sample_locations_values + 1,(int)__dnew == 1,(char *)&name_1);
        if (!negativeLink) {
          if (negativeCompile) {
            if ((int)__dnew != 0) {
              __dnew_1 = (ulong)__dnew_1._1_7_ << 8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1580);
              if ((char)__dnew_1 == '\0') {
                __p = 
                "Negative compilation case failed: shader shoult not compile, but GL_COMPILE_STATUS != 0"
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1580,
                           "Negative compilation case failed: shader shoult not compile, but GL_COMPILE_STATUS != 0"
                           ,0x57);
              }
LAB_00bada3c:
              Logger::~Logger((Logger *)&__dnew_1);
              local_16c8 = 0xffffffffffffffff;
            }
          }
          else if ((int)__dnew != 1) {
            __dnew_1 = (ulong)__dnew_1._1_7_ << 8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1580);
            if ((char)__dnew_1 == '\0') {
              __p = "Shader compilation failed";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1580,"Shader compilation failed",0x19);
            }
            goto LAB_00bada3c;
          }
        }
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
      } while ((_Rb_tree_header *)p_Var22 != &shaders._M_t._M_impl.super__Rb_tree_header);
    }
  }
  if (negativeCompile) {
    p_Var23 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &shaders._M_t._M_impl.super__Rb_tree_header) {
      do {
        __p = (char *)(ulong)*(uint *)&p_Var23[3]._M_parent;
        glu::CallLogWrapper::glDeleteShader(this_00,*(uint *)&p_Var23[3]._M_parent);
        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
      } while ((_Rb_tree_header *)p_Var23 != &shaders._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    if (pvVar51 == pvVar31) {
      uVar37 = 0;
      p_Var23 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pCVar49 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar50 = uVar37;
    }
    else {
      local_16a8 = 0;
      do {
        name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
        name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
        GVar13 = glu::CallLogWrapper::glCreateProgram(this_00);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _4_4_,GVar13);
        pSVar18 = pvVar31[local_16a8].
                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pvVar31[local_16a8].
            super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            ._M_impl.super__Vector_impl_data._M_finish != pSVar18) {
          pvVar31 = pvVar31 + local_16a8;
          lVar42 = 0;
          uVar37 = 0;
          do {
            iVar19 = std::
                     map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                     ::find(&shaders,(key_type *)((long)&pSVar18->stage + lVar42));
            glu::CallLogWrapper::glAttachShader
                      (this_00,(GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream,*(GLuint *)&iVar19._M_node[3]._M_parent);
            pSVar18 = (pvVar31->
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            __args = (uint *)((long)&pSVar18->stage + lVar42);
            if (name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ ==
                name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                         (iterator)name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_,
                         __args);
              pSVar18 = (pvVar31->
                        super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *(uint *)name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *__args;
              name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                   name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 4;
            }
            uVar37 = uVar37 + 1;
            lVar42 = lVar42 + 0x48;
          } while (uVar37 < (ulong)(((long)(pvVar31->
                                           super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar18 >> 3) * -0x71c71c71c71c71c7));
        }
        pCVar53 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pCVar49 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)programs.
                    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)programs.
                    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar50 = (long)programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar37 = uVar50;
          if (programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar37 = 1;
          }
          uVar30 = uVar37 + uVar50;
          if (0x3fffffffffffffe < uVar30) {
            uVar30 = 0x3ffffffffffffff;
          }
          if (CARRY8(uVar37,uVar50)) {
            uVar30 = 0x3ffffffffffffff;
          }
          if (uVar30 == 0) {
            pCVar24 = (pointer)0x0;
          }
          else {
            pCVar24 = (pointer)operator_new(uVar30 << 5);
          }
          pCVar24[uVar50].name =
               (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&pCVar24[uVar50].stages,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          pCVar52 = pCVar24;
          for (pCVar25 = pCVar49; pCVar53 != pCVar25; pCVar25 = pCVar25 + 1) {
            pCVar52->name = pCVar25->name;
            puVar27 = (pCVar25->stages).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            (pCVar52->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pCVar25->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pCVar52->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar27;
            (pCVar52->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pCVar25->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pCVar25->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar25->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar25->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pCVar52 = pCVar52 + 1;
          }
          if (pCVar49 != (pointer)0x0) {
            operator_delete(pCVar49,(long)programs.
                                          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pCVar49);
          }
          programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar24 + uVar30;
          programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_start = pCVar24;
        }
        else {
          (programs.
           super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
           ._M_impl.super__Vector_impl_data._M_finish)->name =
               (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&(programs.
                       super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->stages,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          pCVar52 = pCVar53;
        }
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar52 + 1;
        __p = (char *)(ulong)programs.
                             super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_16a8].name;
        glu::CallLogWrapper::glLinkProgram
                  (this_00,programs.
                           super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_16a8].name);
        if (name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != 0) {
          __p = (char *)(name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ -
                        name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
          operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                          (ulong)__p);
        }
        local_16a8 = local_16a8 + 1;
        uVar37 = ((long)programConfigs.
                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)programConfigs.
                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        pvVar31 = programConfigs.
                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var23 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pCVar49 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar50 = uVar37;
      } while (local_16a8 < uVar37);
    }
    for (; shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var23, uVar37 != 0;
        uVar37 = uVar37 - 1) {
      __p = (char *)(ulong)pCVar49->name;
      glu::CallLogWrapper::glLinkProgram(this_00,pCVar49->name);
      p_Var23 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pCVar49 = pCVar49 + 1;
    }
    while ((_Rb_tree_header *)p_Var23 != &shaders._M_t._M_impl.super__Rb_tree_header) {
      __p = (char *)(ulong)*(uint *)&p_Var23[3]._M_parent;
      glu::CallLogWrapper::glDeleteShader(this_00,*(uint *)&p_Var23[3]._M_parent);
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    }
    if (uVar50 != 0) {
      pCVar49 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        glu::CallLogWrapper::glGetProgramiv(this_00,pCVar49->name,0x8b82,(GLint *)&__dnew_1);
        glu::CallLogWrapper::glGetProgramInfoLog
                  (this_00,pCVar49->name,1000,(GLsizei *)0x0,(GLchar *)&name);
        __p = "program";
        tcu::TestLog::writeCompileInfo
                  (glcts::(anonymous_namespace)::Logger::s_tcuLog,"program",
                   fixed_sample_locations_values + 1,(int)__dnew_1 == 1,(char *)&name);
        if (negativeLink) {
          if ((int)__dnew_1 != 0) {
            name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)
                 ((ulong)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream._1_7_ << 8);
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)
                       &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
            if ((char)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                == '\0') {
              __p = "Negative link case failed: program should not link, but GL_LINK_STATUS != 0";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                         "Negative link case failed: program should not link, but GL_LINK_STATUS != 0"
                         ,0x4b);
            }
LAB_00baded2:
            Logger::~Logger((Logger *)&name_1);
            local_16c8 = 0xffffffffffffffff;
          }
        }
        else if ((int)__dnew_1 != 1) {
          name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)
               ((ulong)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                       ._1_7_ << 8);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          __p = "Shader link failed";
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&name_1,(char (*) [19])"Shader link failed");
          goto LAB_00baded2;
        }
        pCVar49 = pCVar49 + 1;
        uVar50 = uVar50 - 1;
      } while (uVar50 != 0);
    }
  }
  std::
  _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
              *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)__p);
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::~vector(&programConfigs);
  ___tmp_5 = programs.
             super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((local_16c8 == 0 && !negativeLink) && !negativeCompile) &&
      (long)programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar37 = 0;
    do {
      glu::CallLogWrapper::glUseProgram(this_00,___tmp_5[uVar37].name);
      pCVar26 = ___tmp_5 + uVar37;
      pUVar36 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((uniforms->
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          )._M_impl.super__Vector_impl_data._M_finish != pUVar36) {
        lVar42 = 0;
        uVar50 = 0;
        do {
          setUniform(this,(Uniform *)((long)&(pUVar36->type).enumType + lVar42),pCVar26);
          uVar50 = uVar50 + 1;
          pUVar36 = (uniforms->
                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar42 = lVar42 + 0x1d8;
        } while (uVar50 < (ulong)(((long)(uniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar36
                                  >> 3) * -0x34115b1e5f75270d));
      }
      puVar27 = (pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar27) {
        __x_00 = &pCVar26->stages;
        local_1620 = 0;
        do {
          if ((subroutineUniforms->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_finish ==
              (subroutineUniforms->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_start) break;
          glu::CallLogWrapper::glGetProgramStageiv
                    (this_00,pCVar26->name,puVar27[local_1620],0x8e47,(GLint *)&__dnew);
          if ((long)(int)__dnew != 0) {
            name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)
                 ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                 & 0xffffffff00000000);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs,
                       (long)(int)__dnew,(value_type_conflict4 *)&name,(allocator_type *)&name_1);
            pSVar46 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_finish != pSVar46) {
              uVar50 = 0;
              do {
                GVar1 = (__x_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[local_1620];
                bVar10 = DefOccurence::occurs
                                   ((DefOccurence *)(ulong)pSVar46[uVar50].defOccurence.occurence,
                                    GVar1);
                if (((bVar10) && ((pSVar46[uVar50].used & 1U) != 0)) &&
                   (pSVar54 = pSVar46 + uVar50, 0 < pSVar54->arraySize)) {
                  iVar48 = 0;
                  do {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__dnew_1,
                               __x_00);
                    bVar10 = LayoutSpecifierBase::isImplicit
                                       (&(pSVar54->location).super_LayoutSpecifierBase,
                                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        &__dnew_1);
                    if (__dnew_1 != 0) {
                      operator_delete((void *)__dnew_1,local_1580._8_8_ - __dnew_1);
                    }
                    if (bVar10) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&name,(pSVar54->name)._M_dataplus._M_p,
                                 (pSVar54->name)._M_string_length);
                      SubroutineUniform::streamArrayStr(pSVar54,&name,iVar48);
                      GVar13 = pCVar26->name;
                      std::__cxx11::stringbuf::str();
                      uVar14 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                                         (this_00,GVar13,GVar1,
                                          (GLchar *)
                                          name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream);
                      if (name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream !=
                          (_func_int **)
                          &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                        operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream,
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _16_8_ + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
                      std::ios_base::~ios_base
                                ((ios_base *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                                );
                    }
                    else {
                      uVar14 = (pSVar54->location).super_LayoutSpecifierBase.val + iVar48;
                    }
                    if ((int)uVar14 < 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                    ,0x617,
                                    "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                                   );
                    }
                    this_02 = SubroutineUniform::getSelectedFunction(pSVar54,iVar48);
                    pGVar28 = (GLenum *)operator_new(4);
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pGVar28 + 1;
                    *pGVar28 = GVar1;
                    shaders._M_t._M_impl._0_8_ = pGVar28;
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                    bVar10 = LayoutSpecifierBase::isImplicit
                                       ((LayoutSpecifierBase *)this_02,
                                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        &shaders);
                    operator_delete(pGVar28,4);
                    if (bVar10) {
                      GVar13 = glu::CallLogWrapper::glGetSubroutineIndex
                                         (this_00,pCVar26->name,GVar1,
                                          (this_02->name)._M_dataplus._M_p);
                    }
                    else {
                      GVar13 = (this_02->index).super_LayoutSpecifierBase.val;
                    }
                    if ((int)((ulong)((long)programConfigs.
                                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) <=
                        (int)uVar14) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                    ,0x612,
                                    "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                                   );
                    }
                    *(GLuint *)
                     ((long)&((programConfigs.
                               super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                             )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar14 * 4) =
                         GVar13;
                    iVar48 = iVar48 + 1;
                  } while (iVar48 < pSVar54->arraySize);
                }
                uVar50 = uVar50 + 1;
                pSVar46 = (subroutineUniforms->
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (uVar50 < (ulong)(((long)(subroutineUniforms->
                                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar46 >> 3) * 0x4fa4fa4fa4fa4fa5));
            }
            glu::CallLogWrapper::glUniformSubroutinesuiv
                      (this_00,(__x_00->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[local_1620],(int)__dnew,
                       (GLuint *)
                       programConfigs.
                       super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            if (programConfigs.
                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(programConfigs.
                              super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          local_1620 = local_1620 + 1;
          puVar27 = (pCVar26->stages).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_1620 <
                 (ulong)((long)(pCVar26->stages).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar27 >> 2));
      }
      if (*puVar27 == 0x91b9) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&name_1);
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x90d2,
                   (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e9);
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,1,
                   (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
        pfVar29 = (float *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
        if (((*pfVar29 != 0.0) || (NAN(*pfVar29))) ||
           ((pfVar29[1] != 1.0 || (((NAN(pfVar29[1]) || (pfVar29[2] != 0.0)) || (NAN(pfVar29[2])))))
           )) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)
               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
               0xffffffffffffff00);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream == 0
             ) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                       ,"Program ",8);
          }
          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          ;
          if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream & 1
              ) == 0) {
            std::ostream::_M_insert<unsigned_long>
                      ((ulong)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
            bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream;
          }
          if ((bVar40 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                       ,": Wrong color. Expected green, got (",0x24);
            bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream;
          }
          if ((bVar40 & 1) == 0) {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)*pfVar29);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1a8a360);
          if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar29[1]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1a8a360);
          if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar29[2]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1a8a360);
          if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar29[3]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1c6912b);
          Logger::~Logger((Logger *)&name);
          local_15f8 = 0xffffffffffffffff;
        }
        else {
          local_15f8 = 0;
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&name_1);
      }
      else {
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        iVar48 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        iVar48 = *(int *)CONCAT44(extraout_var,iVar48);
        iVar47 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&name_1,
                   (long)(iVar48 * *(int *)(CONCAT44(extraout_var_00,iVar47) + 4) * 4),
                   (allocator_type *)&name);
        iVar48 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        width = *(GLsizei *)CONCAT44(extraout_var_01,iVar48);
        iVar48 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        glu::CallLogWrapper::glReadPixels
                  (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_02,iVar48) + 4),0x1908,
                   0x1401,name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
        if ((_func_int **)name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ !=
            name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream) {
          uVar50 = 0;
          do {
            if (((*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream + uVar50) != '\0') ||
                (*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream + uVar50 + 1) != -1)) ||
               (*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream + uVar50 + 2) != '\0')) {
              name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)
                   ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream & 0xffffffffffffff00);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar44,"Program ",8);
              }
              bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream;
              if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  & 1) == 0) {
                std::ostream::_M_insert<unsigned_long>((ulong)puVar44);
                bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream;
              }
              if ((bVar40 & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)puVar44,": Wrong color. Expected green, got (",0x24);
                bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream;
              }
              if ((bVar40 & 1) == 0) {
                std::ostream::operator<<
                          (puVar44,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar50));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1a8a360);
              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar44,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar50 + 1));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1a8a360);
              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar44,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar50 + 2));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1a8a360);
              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar44,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar50 + 3));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1c6912b);
              Logger::~Logger((Logger *)&name);
              local_15f8 = 0xffffffffffffffff;
              goto LAB_00bae8c4;
            }
            uVar50 = uVar50 + 4;
          } while (uVar50 < (ulong)(name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                   - (long)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream));
        }
        local_15f8 = 0;
LAB_00bae8c4:
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
             0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
        this_01 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
        iVar48 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        iVar48 = *(int *)CONCAT44(extraout_var_03,iVar48);
        iVar47 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        tcu::TestLog::writeImage
                  (this_01,"rendered image",fixed_sample_locations_values + 1,
                   QP_IMAGE_COMPRESSION_MODE_BEST,QP_IMAGE_FORMAT_RGBA8888,iVar48,
                   *(int *)(CONCAT44(extraout_var_04,iVar47) + 4),0,
                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream);
        Logger::~Logger((Logger *)&name);
        if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)0x0) {
          operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ -
                          (long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
        }
      }
      ___tmp_5 = programs.
                 super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ & 0xffffffff00000000;
      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
      glu::CallLogWrapper::glGetIntegerv(this_00,0x826e,(GLint *)&name_1);
      pCVar26 = ___tmp_5 + uVar37;
      pUVar36 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((uniforms->
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          )._M_impl.super__Vector_impl_data._M_finish == pUVar36) {
        local_15a0 = 0;
      }
      else {
        lVar42 = 0;
        uVar50 = 0;
        local_15a0 = 0;
        do {
          uVar30 = runQueryUniform(this,pCVar26,
                                   (Uniform *)((long)&(pUVar36->type).enumType + lVar42),
                                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&name,(GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream);
          local_15a0 = local_15a0 | uVar30;
          uVar50 = uVar50 + 1;
          pUVar36 = (uniforms->
                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar42 = lVar42 + 0x1d8;
        } while (uVar50 < (ulong)(((long)(uniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar36
                                  >> 3) * -0x34115b1e5f75270d));
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&name);
      if ((subroutineUniforms->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (subroutineUniforms->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        glu::CallLogWrapper::glGetIntegerv(this_00,0x8de8,&maxLocation);
        glu::CallLogWrapper::glGetIntegerv(this_00,0x8de7,&maxIndex);
        if ((pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pCVar26->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_1660 = 0;
          do {
            local_1580._0_8_ = local_1580._0_8_ & 0xffffffff00000000;
            local_1580._8_8_ = (undefined1 *)0x0;
            local_1580._16_8_ = local_1580;
            local_1560 = 0;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
            shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pSVar46 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1568 = (_Base_ptr)local_1580._16_8_;
            if ((subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_finish != pSVar46) {
              uVar50 = 0;
              do {
                local_15cc = maxLocation;
                iVar48 = 0;
                if (0 < maxLocation) {
                  iVar48 = maxLocation;
                }
                if (pSVar46[uVar50].arraySize < 1) {
                  local_16c8 = 0;
                }
                else {
                  GVar1 = (pCVar26->stages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_1660];
                  pSVar54 = pSVar46 + uVar50;
                  local_16c8 = 0;
                  iVar47 = 0;
                  do {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&name_1,(pSVar54->name)._M_dataplus._M_p,
                               (pSVar54->name)._M_string_length);
                    SubroutineUniform::streamArrayStr(pSVar54,&name_1,iVar47);
                    GVar13 = pCVar26->name;
                    std::__cxx11::stringbuf::str();
                    uVar14 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                                       (this_00,GVar13,GVar1,
                                        (GLchar *)
                                        name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                        != (_func_int **)
                           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                                      + 1);
                    }
                    if (GVar1 == 0x8b30) {
                      GVar41 = 0x92f2;
                    }
                    else {
                      GVar41 = 0x92ee;
                      if (GVar1 != 0x8b31) {
                        if (GVar1 != 0x91b9) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                        ,0x70f,
                                        "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutine(const CompiledProgram &, GLenum, const SubroutineUniform &, std::set<GLuint> &, GLint)"
                                       );
                        }
                        GVar41 = 0x92f3;
                      }
                    }
                    GVar13 = pCVar26->name;
                    std::__cxx11::stringbuf::str();
                    uVar15 = glu::CallLogWrapper::glGetProgramResourceLocation
                                       (this_00,GVar13,GVar41,
                                        (GLchar *)
                                        name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                        != (_func_int **)
                           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                                      + 1);
                    }
                    if (uVar14 != uVar15) {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
                      ;
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [33])"Locations of subrutine uniform \"")
                      ;
                      std::__cxx11::stringbuf::str();
                      if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   (char *)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                   (long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream;
                      if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                                   ,0x53);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,uVar14);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8," != ",4);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,uVar15);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,".",1);
                      }
                      if (programConfigs.
                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((programConfigs.
                                                                                                                  
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                      }
                      Logger::~Logger((Logger *)&name);
                      local_16c8 = 0xffffffffffffffff;
                    }
                    bVar11 = DefOccurence::occurs
                                       ((DefOccurence *)(ulong)(pSVar54->defOccurence).occurence,
                                        GVar1);
                    bVar10 = pSVar54->used;
                    pGVar28 = (GLenum *)operator_new(4);
                    bVar40 = bVar11 & bVar10;
                    local_15e0 = pGVar28 + 1;
                    *pGVar28 = GVar1;
                    __dnew = (size_type)pGVar28;
                    local_15d8 = local_15e0;
                    bVar10 = LayoutSpecifierBase::isImplicit
                                       (&(pSVar54->location).super_LayoutSpecifierBase,
                                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        &__dnew);
                    operator_delete(pGVar28,4);
                    if (bVar10) {
                      if (bVar40 == 0) goto LAB_00baf22d;
                      uVar15 = uVar14;
                      if (-1 < (int)uVar14) goto LAB_00baf0d5;
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream._1_7_ << 8);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
                      ;
                      if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,"Unexpected subroutine uniform \"",0x1f);
                      }
                      std::__cxx11::stringbuf::str();
                      if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   (char *)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                   (long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream;
                      if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,"\" location: expected positive value, got ",0x29);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,uVar14);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,".",1);
                      }
                      if (programConfigs.
                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((programConfigs.
                                                                                                                  
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                      }
LAB_00baf328:
                      Logger::~Logger((Logger *)&name);
                      local_16c8 = 0xffffffffffffffff;
                    }
                    else {
                      uVar15 = (pSVar54->location).super_LayoutSpecifierBase.val + iVar47;
                      if ((uVar15 != uVar14) && (uVar14 != 0xffffffff || bVar40 != 0)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,"Unexpected subroutine uniform \"",0x1f);
                        }
                        std::__cxx11::stringbuf::str();
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)programConfigs.
                                             super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [22])"\" location: expected ");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == 0) {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar15);
                        }
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                        if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,", got ",6);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar14);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,".",1);
                        }
                        if (programConfigs.
                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(programConfigs.
                                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((programConfigs.
                                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                        }
                        Logger::~Logger((Logger *)&name);
                        local_16c8 = 0xffffffffffffffff;
                      }
                      if (-1 < (int)uVar15) {
LAB_00baf0d5:
                        if ((undefined1 *)local_1580._8_8_ != (undefined1 *)0x0) {
                          puVar44 = local_1580;
                          puVar9 = (undefined1 *)local_1580._8_8_;
                          do {
                            puVar32 = puVar9;
                            puVar43 = puVar44;
                            uVar2 = *(uint *)(puVar32 + 0x20);
                            puVar44 = puVar32;
                            if (uVar2 < uVar15) {
                              puVar44 = puVar43;
                            }
                            puVar9 = *(undefined1 **)(puVar32 + ((ulong)(uVar2 < uVar15) + 2) * 8);
                          } while (*(undefined1 **)(puVar32 + ((ulong)(uVar2 < uVar15) + 2) * 8) !=
                                   (undefined1 *)0x0);
                          if (puVar44 != local_1580) {
                            if (uVar2 < uVar15) {
                              puVar32 = puVar43;
                            }
                            if (*(uint *)(puVar32 + 0x20) <= uVar15) {
                              name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream =
                                   (_func_int **)
                                   ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream & 0xffffffffffffff00);
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)
                                         &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                          field_0x8);
                              glcts::(anonymous_namespace)::Logger::operator<<
                                        ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                              std::__cxx11::stringbuf::str();
                              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)
                                           &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                            field_0x8,
                                           (char *)programConfigs.
                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           (long)programConfigs.
                                                 super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish);
                              }
                              bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>
                                             ._vptr_basic_ostream;
                              if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream & 1) == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)
                                           &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                            field_0x8,"\" location (",0xc);
                                bVar40 = (byte)name.
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream;
                              }
                              if ((bVar40 & 1) == 0) {
                                std::ostream::operator<<
                                          (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                            field_0x8,uVar15);
                                bVar40 = (byte)name.
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream;
                              }
                              if ((bVar40 & 1) == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)
                                           &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                            field_0x8,") is not unique.",0x10);
                              }
                              if (programConfigs.
                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start !=
                                  (pointer)&programConfigs.
                                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete(programConfigs.
                                                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (ulong)((long)&((programConfigs.
                                                                                                                                  
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                              }
                              Logger::~Logger((Logger *)&name);
                              local_16c8 = 0xffffffffffffffff;
                            }
                          }
                        }
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream._4_4_,uVar15);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::_M_insert_unique<unsigned_int>
                                  ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&__dnew_1,(uint *)&name);
                      }
LAB_00baf22d:
                      if (iVar48 <= (int)uVar14) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream & 0xffffffffffffff00);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                        std::__cxx11::stringbuf::str();
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)programConfigs.
                                             super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [22])"\" returned location (");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == 0) {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar14);
                        }
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                        if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,") is greater than implementation dependent limit ("
                                     ,0x32);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,local_15cc);
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [3])0x1c6912b);
                        if (programConfigs.
                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(programConfigs.
                                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((programConfigs.
                                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                        }
                        goto LAB_00baf328;
                      }
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
                    std::ios_base::~ios_base
                              ((ios_base *)
                               &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                              );
                    iVar47 = iVar47 + 1;
                  } while (iVar47 < pSVar54->arraySize);
                  pSVar46 = (subroutineUniforms->
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                }
                local_15a0 = local_16c8 | local_15a0;
                pSVar39 = pSVar46[uVar50].functions.fn.
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar46[uVar50].functions.fn.
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pSVar39) {
                  ___tmp_4 = 0;
                  do {
                    GVar7 = maxIndex;
                    GVar1 = (pCVar26->stages).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_1660];
                    bVar10 = DefOccurence::occurs
                                       ((DefOccurence *)
                                        (ulong)pSVar46[uVar50].defOccurence.occurence,GVar1);
                    if (bVar10) {
                      bVar40 = (subroutineUniforms->
                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar50].used;
                    }
                    else {
                      bVar40 = 0;
                    }
                    pSVar39 = pSVar39 + ___tmp_4;
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                         (_func_int **)
                         &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
                    pcVar4 = (pSVar39->name)._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&name_1,pcVar4,pcVar4 + (pSVar39->name)._M_string_length);
                    _Var16 = glu::CallLogWrapper::glGetSubroutineIndex
                                       (this_00,pCVar26->name,GVar1,
                                        (GLchar *)
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (GVar1 == 0x8b30) {
                      GVar41 = 0x92ec;
                    }
                    else {
                      GVar41 = 0x92e8;
                      if (GVar1 != 0x8b31) {
                        if (GVar1 != 0x91b9) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                        ,0x77c,
                                        "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutineFunction(const CompiledProgram &, GLenum, const SubroutineFunction &, std::set<GLuint> &, GLint, bool)"
                                       );
                        }
                        GVar41 = 0x92ed;
                      }
                    }
                    _Var17 = glu::CallLogWrapper::glGetProgramResourceIndex
                                       (this_00,pCVar26->name,GVar41,
                                        (GLchar *)
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (_Var16 == _Var17) {
                      uVar30 = 0;
                    }
                    else {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [33])"Indices of subroutine function \"")
                      ;
                      if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar44,
                                   (char *)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream,
                                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
                      }
                      bVar12 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream;
                      if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar44,
                                   "\" returned by glGetSubroutineIndex and differ glGetProgramResourceIndex differ: "
                                   ,0x50);
                        bVar12 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar12 & 1) == 0) {
                        std::ostream::operator<<(puVar44,_Var16);
                        bVar12 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar12 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar44," != ",4);
                        bVar12 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar12 & 1) == 0) {
                        std::ostream::operator<<(puVar44,_Var17);
                        bVar12 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar12 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar44,".",1)
                        ;
                      }
                      Logger::~Logger((Logger *)&name);
                      uVar30 = 0xffffffffffffffff;
                    }
                    pvVar31 = (pointer)operator_new(4);
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)((long)&(pvVar31->
                                          super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 4);
                    *(GLenum *)
                     &(pvVar31->
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      )._M_impl.super__Vector_impl_data._M_start = GVar1;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = pvVar31;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         programConfigs.
                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    bVar10 = LayoutSpecifierBase::isImplicit
                                       ((LayoutSpecifierBase *)pSVar39,
                                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        &programConfigs);
                    operator_delete(pvVar31,4);
                    if (bVar10) {
                      if (bVar40 == 0) goto LAB_00baf8e0;
                      _Var17 = _Var16;
                      if (-1 < (int)_Var16) goto LAB_00baf7d6;
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream._1_7_ << 8);
                      puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [33])"Unexpected subroutine function \"")
                      ;
                      if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar44,
                                   (char *)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream,
                                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
                      }
                      bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream;
                      if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar44,"\" index: expected positive value, got ",0x26
                                  );
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::ostream::operator<<(puVar44,_Var16);
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                      }
                      if ((bVar40 & 1) == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar44,".",1)
                        ;
                      }
LAB_00baf9a6:
                      Logger::~Logger((Logger *)&name);
                      uVar30 = 0xffffffffffffffff;
                    }
                    else {
                      _Var17 = (pSVar39->index).super_LayoutSpecifierBase.val;
                      if (((~bVar40 & _Var16 == ~_S_red) == 0) && (_Var17 != _Var16)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                        ;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,
                                   (char (*) [33])"Unexpected subroutine function \"");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar44,
                                     (char *)name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream,
                                     name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                    );
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [19])"\" index: expected ");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == 0) {
                          std::ostream::operator<<(puVar44,_Var17);
                        }
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                        if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar44,", got ",6);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::ostream::operator<<(puVar44,_Var16);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar44,".",1);
                        }
                        Logger::~Logger((Logger *)&name);
                        uVar30 = 0xffffffffffffffff;
                      }
                      if (-1 < (int)_Var17) {
LAB_00baf7d6:
                        if (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                            (_Base_ptr)0x0) {
                          p_Var22 = &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
                          p_Var8 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                          do {
                            p_Var33 = p_Var8;
                            p_Var45 = p_Var22;
                            _Var3 = p_Var33[1]._M_color;
                            p_Var22 = p_Var33;
                            if (_Var3 < _Var17) {
                              p_Var22 = p_Var45;
                            }
                            p_Var8 = (&p_Var33->_M_left)[_Var3 < _Var17];
                          } while ((&p_Var33->_M_left)[_Var3 < _Var17] != (_Base_ptr)0x0);
                          if ((_Rb_tree_header *)p_Var22 !=
                              &shaders._M_t._M_impl.super__Rb_tree_header) {
                            if (_Var3 < _Var17) {
                              p_Var33 = p_Var45;
                            }
                            if (p_Var33[1]._M_color <= _Var17) {
                              name.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream =
                                   (_func_int **)
                                   ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream & 0xffffffffffffff00);
                              puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         field_0x8;
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
                              glcts::(anonymous_namespace)::Logger::operator<<
                                        ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream == '\0') {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)puVar44,
                                           (char *)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream,
                                           name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._8_8_);
                              }
                              glcts::(anonymous_namespace)::Logger::operator<<
                                        ((Logger *)&name,(char (*) [10])"\" index (");
                              if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream == 0) {
                                std::ostream::operator<<(puVar44,_Var17);
                              }
                              if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream & 1) == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)puVar44,") is not unique.",0x10);
                              }
                              Logger::~Logger((Logger *)&name);
                              uVar30 = 0xffffffffffffffff;
                            }
                          }
                        }
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream._4_4_,_Var17);
                        std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::_M_insert_unique<unsigned_int>
                                  ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&shaders,(uint *)&name);
                      }
LAB_00baf8e0:
                      if (GVar7 <= (int)_Var16 && -1 < (int)_Var16) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream & 0xffffffffffffff00);
                        puVar44 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                        ;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar44);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar44,
                                     (char *)name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream,
                                     name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                    );
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [19])"\" returned index (");
                        if ((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == 0) {
                          std::ostream::operator<<(puVar44,_Var16);
                        }
                        bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream;
                        if (((byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 1) == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar44,
                                     ") is greater than implementation dependent limit (",0x32);
                          bVar40 = (byte)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream;
                        }
                        if ((bVar40 & 1) == 0) {
                          std::ostream::operator<<(puVar44,GVar7);
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [3])0x1c6912b);
                        goto LAB_00baf9a6;
                      }
                    }
                    if (name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream !=
                        (_func_int **)
                        &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _16_8_ + 1);
                    }
                    local_15a0 = local_15a0 | uVar30;
                    ___tmp_4 = ___tmp_4 + 1;
                    pSVar46 = (subroutineUniforms->
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    pSVar39 = pSVar46[uVar50].functions.fn.
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  } while (___tmp_4 <
                           (ulong)(((long)pSVar46[uVar50].functions.fn.
                                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar39
                                   >> 3) * 0xf83e0f83e0f83e1));
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 < (ulong)(((long)(subroutineUniforms->
                                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar46 >> 3) * 0x4fa4fa4fa4fa4fa5));
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&shaders);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&__dnew_1);
            local_1660 = local_1660 + 1;
          } while (local_1660 <
                   (ulong)((long)(pCVar26->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pCVar26->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
          ___tmp_5 = programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar50 = (long)programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)___tmp_5 >> 5;
      local_16c8 = local_15a0 | local_15f8;
    } while ((local_16c8 == 0) && (uVar37 = uVar37 + 1, uVar37 < uVar50));
  }
  else {
    uVar50 = (long)programs.
                   super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)programs.
                   super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  pCVar49 = programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  if (pCVar49 != ___tmp_5) {
    lVar42 = uVar50 + (uVar50 == 0);
    pCVar53 = ___tmp_5;
    do {
      glu::CallLogWrapper::glDeleteProgram(this_00,pCVar53->name);
      pCVar53 = pCVar53 + 1;
      lVar42 = lVar42 + -1;
      pCVar24 = ___tmp_5;
    } while (lVar42 != 0);
    do {
      puVar27 = (pCVar24->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (puVar27 != (pointer)0x0) {
        operator_delete(puVar27,(long)(pCVar24->stages).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar27);
      }
      pCVar24 = pCVar24 + 1;
    } while (pCVar24 != pCVar49);
    programs.
    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
    ._M_impl.super__Vector_impl_data._M_finish = ___tmp_5;
  }
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&vbo);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&vao);
  std::
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ::~vector(&programs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)parentUniformName._M_dataplus._M_p != &parentUniformName.field_2) {
    operator_delete(parentUniformName._M_dataplus._M_p,
                    parentUniformName.field_2._M_allocated_capacity + 1);
  }
  return local_16c8;
}

Assistant:

long doRun(std::vector<Uniform>& uniforms, std::vector<SubroutineUniform>& subroutineUniforms,
			   std::string additionalDef = "", bool negativeCompile = false, bool negativeLink = false)
	{
		long		ret				  = NO_ERROR;
		std::string parentUniformName = "";
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i;
			uniforms[i].setName(parentUniformName, name.str());
		}
		int subroutineTypeCounter	 = 0;
		int subroutineFunctionCounter = 0;
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i + uniforms.size();
			subroutineUniforms[i].setName(name.str());
			if (!subroutineUniforms[i].functions.getTypeName().size())
			{
				subroutineUniforms[i].functions.setTypeName(subroutineTypeCounter++);
				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					subroutineUniforms[i].functions.fn[fn].setName(subroutineFunctionCounter++);
				}
			}
		}

		GLfloat coords[] = {
			1.0f, -1.0f, 0.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
		};

		GLuint vbo, vao;
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(coords), coords, GL_STATIC_DRAW);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, NULL);
		glEnableVertexAttribArray(0);

		std::vector<CompiledProgram> programs;
		ret |= CreatePrograms(programs, uniforms, subroutineUniforms, additionalDef, negativeCompile, negativeLink);

		for (size_t i = 0; i < programs.size() && ret == NO_ERROR && !negativeCompile && !negativeLink; i++)
		{
			ret |= runExecuteProgram(programs[i], uniforms, subroutineUniforms);
			ret |= runQueryProgram(programs[i], uniforms, subroutineUniforms);
		}

		glUseProgram(0);

		DeletePrograms(programs);

		glDeleteBuffers(1, &vbo);
		glDeleteVertexArrays(1, &vao);

		return ret;
	}